

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutSopBalanceEvalInt
              (Vec_Int_t *vCover,int *pTimes,int *pFaninLits,Vec_Int_t *vAig,int *piRes,int nSuppAll
              ,int *pArea)

{
  int Num;
  int iVar1;
  uint uVar2;
  int local_380;
  int local_37c;
  int local_360;
  int local_35c;
  int local_344;
  int local_324;
  int local_320;
  int iRes;
  int Delay;
  int nLits;
  int Literal;
  int Entry;
  int k;
  int i;
  int pFaninLitsOr [70];
  int local_1e8 [2];
  int pCounterOr [70];
  int local_c8;
  int nCounterOr;
  int pFaninLitsAnd [15];
  int pCounterAnd [15];
  int local_40;
  int local_3c;
  int nCounterAnd;
  int nSuppAll_local;
  int *piRes_local;
  Vec_Int_t *vAig_local;
  int *pFaninLits_local;
  int *pTimes_local;
  Vec_Int_t *vCover_local;
  
  local_320 = 0;
  local_324 = 0;
  local_3c = nSuppAll;
  _nCounterAnd = piRes;
  piRes_local = &vAig->nCap;
  vAig_local = (Vec_Int_t *)pFaninLits;
  pFaninLits_local = pTimes;
  pTimes_local = &vCover->nCap;
  iVar1 = Vec_IntSize(vCover);
  if (iVar1 < 0x47) {
    pCounterOr[0x45] = 0;
    for (Entry = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pTimes_local), Entry < iVar1; Entry = Entry + 1
        ) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pTimes_local,Entry);
      iRes = 0;
      local_40 = 0;
      for (Literal = 0; Literal < local_3c; Literal = Literal + 1) {
        uVar2 = iVar1 >> ((byte)(Literal << 1) & 0x1f) & 3;
        if (uVar2 == 1) {
          iRes = iRes + 1;
          Num = pFaninLits_local[Literal];
          if (piRes_local == (int *)0x0) {
            local_344 = -1;
          }
          else {
            local_344 = Abc_LitNot((&vAig_local->nCap)[Literal]);
          }
          local_320 = If_LogCounterAddAig(pFaninLitsAnd + 0xe,&local_40,&local_c8,Num,local_344,
                                          (Vec_Int_t *)piRes_local,local_3c,0,0);
        }
        else if (uVar2 == 2) {
          iRes = iRes + 1;
          if (piRes_local == (int *)0x0) {
            local_35c = -1;
          }
          else {
            local_35c = (&vAig_local->nCap)[Literal];
          }
          local_320 = If_LogCounterAddAig(pFaninLitsAnd + 0xe,&local_40,&local_c8,
                                          pFaninLits_local[Literal],local_35c,
                                          (Vec_Int_t *)piRes_local,local_3c,0,0);
        }
        else if (uVar2 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                        ,0xd3,
                        "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                       );
        }
      }
      if (local_40 < 1) {
        __assert_fail("nCounterAnd > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xd5,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      if (iRes < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                      ,0xd6,
                      "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                     );
      }
      if (piRes_local == (int *)0x0) {
        if (iRes == 1) {
          local_360 = 0;
        }
        else {
          local_360 = iRes + -1;
        }
        *pArea = local_360 + *pArea;
      }
      else {
        local_324 = If_LogCreateAndXorMulti((Vec_Int_t *)piRes_local,&local_c8,local_40,local_3c,0);
      }
      if (piRes_local == (int *)0x0) {
        local_37c = -1;
      }
      else {
        local_37c = Abc_LitNot(local_324);
      }
      local_320 = If_LogCounterAddAig(local_1e8,pCounterOr + 0x45,&k,local_320,local_37c,
                                      (Vec_Int_t *)piRes_local,local_3c,0,0);
    }
    if (pCounterOr[0x45] < 1) {
      __assert_fail("nCounterOr > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDelay.c"
                    ,0xdd,
                    "int If_CutSopBalanceEvalInt(Vec_Int_t *, int *, int *, Vec_Int_t *, int *, int, int *)"
                   );
    }
    if (piRes_local == (int *)0x0) {
      iVar1 = Vec_IntSize((Vec_Int_t *)pTimes_local);
      if (iVar1 == 1) {
        local_380 = 0;
      }
      else {
        local_380 = Vec_IntSize((Vec_Int_t *)pTimes_local);
        local_380 = local_380 + -1;
      }
      *pArea = local_380 + *pArea;
    }
    else {
      iVar1 = If_LogCreateAndXorMulti((Vec_Int_t *)piRes_local,&k,pCounterOr[0x45],local_3c,0);
      iVar1 = Abc_LitNot(iVar1);
      *_nCounterAnd = iVar1;
      if ((*pTimes_local >> 0x10 & 1U) != 0) {
        iVar1 = Abc_LitNot(*_nCounterAnd);
        *_nCounterAnd = iVar1;
      }
    }
    vCover_local._4_4_ = local_320;
  }
  else {
    vCover_local._4_4_ = -1;
  }
  return vCover_local._4_4_;
}

Assistant:

int If_CutSopBalanceEvalInt( Vec_Int_t * vCover, int * pTimes, int * pFaninLits, Vec_Int_t * vAig, int * piRes, int nSuppAll, int * pArea )
{
    int nCounterAnd, pCounterAnd[IF_MAX_FUNC_LUTSIZE], pFaninLitsAnd[IF_MAX_FUNC_LUTSIZE];
    int nCounterOr,  pCounterOr[IF_MAX_CUBES],  pFaninLitsOr[IF_MAX_CUBES];
    int i, k, Entry, Literal, nLits, Delay = 0, iRes = 0;
    if ( Vec_IntSize(vCover) > IF_MAX_CUBES )
        return -1;
    nCounterOr = 0;
    Vec_IntForEachEntry( vCover, Entry, i )
    { 
        nCounterAnd = nLits = 0;
        for ( k = 0; k < nSuppAll; k++ )
        {
            Literal = 3 & (Entry >> (k << 1));
            if ( Literal == 1 ) // neg literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? Abc_LitNot(pFaninLits[k]) : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal == 2 ) // pos literal
                nLits++, Delay = If_LogCounterAddAig( pCounterAnd, &nCounterAnd, pFaninLitsAnd, pTimes[k], vAig ? pFaninLits[k] : -1, vAig, nSuppAll, 0, 0 );
            else if ( Literal != 0 ) 
                assert( 0 );
        }
        assert( nCounterAnd > 0 );
        assert( nLits > 0 );
        if ( vAig )
            iRes = If_LogCreateAndXorMulti( vAig, pFaninLitsAnd, nCounterAnd, nSuppAll, 0 );
        else
            *pArea += nLits == 1 ? 0 : nLits - 1;
        Delay = If_LogCounterAddAig( pCounterOr, &nCounterOr, pFaninLitsOr, Delay, vAig ? Abc_LitNot(iRes) : -1, vAig, nSuppAll, 0, 0 );
    }
    assert( nCounterOr > 0 );
    if ( vAig )
    {
        *piRes = Abc_LitNot( If_LogCreateAndXorMulti( vAig, pFaninLitsOr, nCounterOr, nSuppAll, 0 ) );
        if ( ((vCover->nCap >> 16) & 1) )  // hack to remember complemented attribute
            *piRes = Abc_LitNot( *piRes );
    }
    else       
        *pArea += Vec_IntSize(vCover) == 1 ? 0 : Vec_IntSize(vCover) - 1;
    return Delay;
}